

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMTrack.cpp
# Opt level: O3

void __thiscall
Storage::Disk::PCMTrack::add_segment
          (PCMTrack *this,Time *start_time,PCMSegment *segment,bool clamp_to_index_hole)

{
  _Bit_type *p_Var1;
  ulong *puVar2;
  _Bit_type *p_Var3;
  _Bit_type *p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  byte bVar10;
  PCMSegment *pPVar11;
  Time *pTVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong *puVar16;
  ulong uVar17;
  uint64_t clock_rate;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong *puVar21;
  ulong uVar22;
  uint64_t length;
  long lVar23;
  char cVar24;
  uint uVar25;
  ulong uVar26;
  Time local_38;
  
  pPVar11 = PCMSegmentEventSource::segment
                      ((this->segment_event_sources_).
                       super__Vector_base<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  Time::Time(&local_38,
             (ulong)((*(int *)&(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     *(int *)&(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
                    (segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset) *
             (ulong)(segment->length_of_a_bit).length,(ulong)(segment->length_of_a_bit).clock_rate);
  uVar22 = (ulong)local_38 & 0xffffffff;
  pTVar12 = start_time;
  if (uVar22 != 0) {
    clock_rate = (ulong)local_38 >> 0x20;
    uVar25 = start_time->clock_rate;
    if (uVar25 == local_38.clock_rate) {
      length = uVar22 + start_time->length;
    }
    else {
      length = uVar22 * uVar25 + start_time->length * clock_rate;
      clock_rate = clock_rate * uVar25;
    }
    Time::Time(&local_38,length,clock_rate);
    pTVar12 = &local_38;
  }
  puVar21 = (pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  puVar16 = (pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar25 = (pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  uVar22 = (ulong)uVar25 + ((long)puVar16 - (long)puVar21) * 8;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = start_time->length * uVar22;
  auVar7 = auVar7 / ZEXT416(start_time->clock_rate);
  uVar13 = auVar7._0_8_;
  uVar14 = (((ulong)*pTVar12 & 0xffffffff) * uVar22) / ((ulong)*pTVar12 >> 0x20);
  uVar20 = uVar14 - uVar13;
  uVar15 = uVar20 / (((long)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 0x10 +
                    (ulong)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset * 2
                    );
  bVar10 = auVar7[0];
  if ((clamp_to_index_hole) || (uVar14 <= uVar22)) {
    if (uVar22 < uVar14) {
      uVar14 = uVar22;
    }
    uVar22 = uVar13 + 0x3f;
    if (-1 < (long)uVar13) {
      uVar22 = uVar13;
    }
    uVar26 = (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001);
    uVar18 = uVar14 + 0x3f;
    if (-1 < (long)uVar14) {
      uVar18 = uVar14;
    }
    puVar16 = puVar21 + ((long)uVar22 >> 6) + uVar26 + -1;
    uVar17 = (ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001);
    uVar25 = (uint)uVar14 & 0x3f;
    cVar24 = (char)uVar25;
    if (puVar21 + ((long)uVar22 >> 6) + uVar26 == puVar21 + ((long)uVar18 >> 6) + uVar17) {
      if ((auVar7._0_4_ & 0x3f) == uVar25) goto LAB_00444216;
      uVar22 = ((0xffffffffffffffffU >> (-cVar24 & 0x3fU)) >> (bVar10 & 0x3f)) << (bVar10 & 0x3f);
    }
    else {
      if ((auVar7 & (undefined1  [16])0x3f) != (undefined1  [16])0x0) {
        *puVar16 = *puVar16 & ~(-1L << (bVar10 & 0x3f));
        puVar16 = puVar21 + ((long)uVar22 >> 6) + uVar26;
      }
      memset(puVar16,0,(long)(puVar21 + ((long)uVar18 >> 6) + (uVar17 - 1)) - (long)puVar16);
      if ((uVar14 & 0x3f) == 0) goto LAB_00444216;
      uVar22 = 0xffffffffffffffff >> (-cVar24 & 0x3fU);
      puVar16 = puVar21 + ((long)uVar18 >> 6) + (uVar17 - 1);
    }
    *puVar16 = *puVar16 & ~uVar22;
LAB_00444216:
    p_Var3 = (segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar22 = ((long)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var3)
             * 8 + (ulong)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
    if (uVar22 != 0) {
      p_Var4 = (pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      p_Var1 = (pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
      uVar25 = (pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
      uVar14 = 0;
      do {
        uVar18 = uVar14 + 0x3f;
        if (-1 < (long)uVar14) {
          uVar18 = uVar14;
        }
        if ((p_Var3[((long)uVar18 >> 6) +
                    (ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff
                   ] >> (uVar14 & 0x3f) & 1) != 0) {
          uVar18 = (uVar14 * uVar20) / uVar22 + uVar15 + uVar13;
          if ((ulong)uVar25 + ((long)p_Var1 - (long)p_Var4) * 8 <= uVar18) {
            return;
          }
          uVar26 = uVar18 + 0x3f;
          if (-1 < (long)uVar18) {
            uVar26 = uVar18;
          }
          puVar21 = p_Var4 + ((long)uVar26 >> 6) +
                             (ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) +
                             0xffffffffffffffff;
          *puVar21 = *puVar21 | 1L << ((byte)uVar18 & 0x3f);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < uVar22);
    }
    return;
  }
  if (uVar20 < uVar22) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar22;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar14;
    auVar8 = auVar8 % auVar5;
    uVar18 = auVar8._0_8_;
    uVar22 = uVar18 + 0x3f;
    if (-1 < (long)uVar18) {
      uVar22 = uVar18;
    }
    puVar16 = puVar21 + ((long)uVar22 >> 6) +
                        ((ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) - 1);
    if (puVar21 != puVar16) {
      memset(puVar21,0,(long)puVar16 - (long)puVar21);
      puVar21 = puVar16;
    }
    if ((auVar8 & (undefined1  [16])0x3f) != (undefined1  [16])0x0) {
      *puVar21 = *puVar21 & ~(0xffffffffffffffffU >> (-(auVar8[0] & 0x3f) & 0x3f));
    }
    uVar22 = uVar13 + 0x3f;
    if (-1 < (long)uVar13) {
      uVar22 = uVar13;
    }
    puVar16 = (pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
              ((long)uVar22 >> 6) + (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001);
    puVar21 = puVar16 + -1;
    puVar2 = (pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    uVar25 = (pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
    cVar24 = (char)uVar25;
    if (puVar21 == puVar2) {
      if ((auVar7._0_4_ & 0x3f) == uVar25) goto LAB_004443ce;
      uVar22 = ((0xffffffffffffffffU >> (-cVar24 & 0x3fU)) >> (bVar10 & 0x3f)) << (bVar10 & 0x3f);
    }
    else {
      if ((auVar7 & (undefined1  [16])0x3f) != (undefined1  [16])0x0) {
        *puVar21 = *puVar21 & ~(-1L << (bVar10 & 0x3f));
        puVar21 = puVar16;
      }
      memset(puVar21,0,(long)puVar2 - (long)puVar21);
      puVar21 = puVar2;
joined_r0x004441d6:
      if (uVar25 == 0) goto LAB_004443ce;
      uVar22 = 0xffffffffffffffff >> (-cVar24 & 0x3fU);
    }
  }
  else {
    cVar24 = (char)uVar25;
    if (puVar21 != puVar16) {
      memset(puVar21,0,(long)puVar16 - (long)puVar21);
      puVar21 = puVar16;
      goto joined_r0x004441d6;
    }
    if (uVar25 == 0) goto LAB_004443ce;
    uVar22 = 0xffffffffffffffff >> (-cVar24 & 0x3fU);
  }
  *puVar21 = *puVar21 & ~uVar22;
LAB_004443ce:
  p_Var3 = (segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar22 = (ulong)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
           ((long)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var3) *
           8;
  lVar23 = uVar22 - 1;
  if (lVar23 < 0) {
    return;
  }
  p_Var4 = (pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar18 = (ulong)(pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
           ((long)(pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var4) *
           8;
  uVar26 = uVar22;
  do {
    uVar26 = uVar26 - 1;
    if ((p_Var3[uVar26 >> 6] >> (uVar26 & 0x3f) & 1) != 0) {
      uVar17 = (lVar23 * uVar20) / uVar22 + uVar15 + uVar13;
      if (uVar17 < uVar14 - uVar18) {
        return;
      }
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar18;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar17;
      uVar19 = SUB168(auVar9 % auVar6,0);
      uVar17 = uVar19 + 0x3f;
      if (-1 < (long)uVar19) {
        uVar17 = uVar19;
      }
      puVar21 = p_Var4 + ((long)uVar17 >> 6) +
                         (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) +
                         0xffffffffffffffff;
      *puVar21 = *puVar21 | 1L << (SUB161(auVar9 % auVar6,0) & 0x3f);
    }
    lVar23 = lVar23 + -1;
  } while (0 < (long)uVar26);
  return;
}

Assistant:

void PCMTrack::add_segment(const Time &start_time, const PCMSegment &segment, bool clamp_to_index_hole) {
	// Get a reference to the destination.
	PCMSegment &destination = segment_event_sources_.front().segment();

	// Determine the range to fill on the target segment.
	const Time end_time = start_time + segment.length();
	const size_t start_bit = start_time.length * destination.data.size() / start_time.clock_rate;
	const size_t end_bit = end_time.length * destination.data.size() / end_time.clock_rate;
	const size_t target_width = end_bit - start_bit;
	const size_t half_offset = target_width / (2 * segment.data.size());

	if(clamp_to_index_hole || end_bit <= destination.data.size()) {
		// If clamping is applied, just write a single segment, from the start_bit to whichever is
		// closer of the end of track and the end_bit.
		const size_t selected_end_bit = std::min(end_bit, destination.data.size());

		// Reset the destination.
		std::fill(destination.data.begin() + ptrdiff_t(start_bit), destination.data.begin() + ptrdiff_t(selected_end_bit), false);

		// Step through the source data from start to finish, stopping early if it goes out of bounds.
		for(size_t bit = 0; bit < segment.data.size(); ++bit) {
			if(segment.data[bit]) {
				const size_t output_bit = start_bit + half_offset + (bit * target_width) / segment.data.size();
				if(output_bit >= destination.data.size()) return;
				destination.data[output_bit] = true;
			}
		}
	} else {
		// Clamping is not enabled, so the supplied segment loops over the index hole, arbitrarily many times.
		// So work backwards unless or until the original start position is reached, then stop.

		// This definitely runs over the index hole; check whether the whole track needs clearing, or whether
		// a centre segment is untouched.
		if(target_width >= destination.data.size()) {
			std::fill(destination.data.begin(), destination.data.end(), false);
		} else {
			std::fill(destination.data.begin(), destination.data.begin() + ptrdiff_t(end_bit % destination.data.size()), false);
			std::fill(destination.data.begin() + ptrdiff_t(start_bit), destination.data.end(), false);
		}

		// Run backwards from final bit back to first, stopping early if overlapping the beginning.
		for(auto bit = ptrdiff_t(segment.data.size()-1); bit >= 0; --bit) {
			// Store flux transitions only; non-transitions can be ignored.
			if(segment.data[size_t(bit)]) {
				// Map to the proper output destination; stop if now potentially overwriting where we began.
				const size_t output_bit = start_bit + half_offset + (size_t(bit) * target_width) / segment.data.size();
				if(output_bit < end_bit - destination.data.size()) return;

				// Store.
				destination.data[output_bit % destination.data.size()] = true;
			}
		}
	}
}